

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

void __thiscall mnf::ConstSubPoint::ConstSubPoint(ConstSubPoint *this,Manifold *M,ConstRefVec *val)

{
  RefCounter *pRVar1;
  long lVar2;
  PointerType pdVar3;
  Index outer_stride;
  Index IVar4;
  undefined8 uVar5;
  
  this->manifold_ = M;
  lVar2 = (val->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (lVar2 < 0) {
    __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  pdVar3 = (val->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  *(undefined8 *)
   &(this->value_).
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> =
       0;
  *(undefined8 *)
   &(this->value_).
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    field_0x8 = 0;
  *(PointerType *)
   &(this->value_).
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> =
       pdVar3;
  *(long *)&(this->value_).
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            .field_0x8 = lVar2;
  Eigen::IOFormat::IOFormat(&this->format_,(IOFormat *)defaultFormat);
  IVar4 = Manifold::representationDim(M);
  if (IVar4 == (val->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_rows.m_value) {
    pRVar1 = &this->manifold_->super_RefCounter;
    pRVar1->count_ = pRVar1->count_ + 1;
    return;
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&mnf_exception::typeinfo,0);
}

Assistant:

ConstSubPoint::ConstSubPoint(const Manifold& M, const ConstRefVec& val)
    : manifold_(M),
      value_(Eigen::Map<Eigen::VectorXd>(const_cast<double*>(val.data()),
                                         val.size())),
      format_(mnf::defaultFormat)
{
  mnf_assert(M.representationDim() == val.size());
  registerPoint();
}